

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

Vec_Str_t * Gia_AigerWriteMappingDoc(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  Vec_Str_t *pVVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  
  iVar12 = p->nObjs;
  uVar21 = (ulong)iVar12;
  if ((long)uVar21 < 2) {
    iVar15 = 0;
    iVar19 = 2;
    uVar20 = 0;
  }
  else {
    uVar2 = p->vMapping->nSize;
    uVar14 = 1;
    if (1 < (int)uVar2) {
      uVar14 = (ulong)uVar2;
    }
    uVar20 = 0;
    iVar19 = 2;
    uVar16 = 1;
    iVar15 = 0;
    do {
      if (uVar14 == uVar16) goto LAB_0064bc28;
      piVar5 = p->vMapping->pArray;
      uVar3 = piVar5[uVar16];
      uVar4 = uVar20;
      if ((ulong)uVar3 != 0) {
        if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar3)) goto LAB_0064bc28;
        iVar15 = iVar15 + 1;
        uVar4 = piVar5[uVar3];
        iVar19 = iVar19 + uVar4 + 2;
        if ((int)uVar4 < (int)uVar20) {
          uVar4 = uVar20;
        }
      }
      uVar20 = uVar4;
      uVar16 = uVar16 + 1;
    } while (uVar21 != uVar16);
  }
  iVar1 = iVar19 * 4;
  pcVar7 = (char *)malloc((long)iVar1);
  iVar11 = 0x18;
  pcVar8 = pcVar7;
  do {
    *pcVar8 = (char)(iVar15 >> ((byte)iVar11 & 0x1f));
    pcVar8 = pcVar8 + 1;
    iVar11 = iVar11 + -8;
  } while (iVar11 != -8);
  pcVar8 = pcVar7 + 4;
  iVar15 = 0x18;
  do {
    *pcVar8 = (char)(uVar20 >> ((byte)iVar15 & 0x1f));
    pcVar8 = pcVar8 + 1;
    iVar15 = iVar15 + -8;
  } while (iVar15 != -8);
  iVar15 = 2;
  if (1 < iVar12) {
    pVVar6 = p->vMapping;
    lVar9 = 2;
    uVar14 = 1;
    do {
      if ((long)pVVar6->nSize <= (long)uVar14) {
LAB_0064bc28:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar6->pArray[uVar14] != 0) {
        iVar15 = (int)lVar9 * 4;
        pcVar8 = pcVar7 + iVar15;
        iVar12 = 0x18;
        do {
          *pcVar8 = (char)((uint)uVar14 >> ((byte)iVar12 & 0x1f));
          pcVar8 = pcVar8 + 1;
          iVar12 = iVar12 + -8;
        } while (iVar12 != -8);
        if ((long)pVVar6->nSize <= (long)uVar14) goto LAB_0064bc28;
        iVar12 = pVVar6->pArray[uVar14];
        if (((long)iVar12 < 0) || (pVVar6->nSize <= iVar12)) goto LAB_0064bc28;
        pcVar8 = pcVar7 + (iVar15 + 4);
        iVar12 = pVVar6->pArray[iVar12];
        iVar15 = 0x18;
        do {
          *pcVar8 = (char)(iVar12 >> ((byte)iVar15 & 0x1f));
          pcVar8 = pcVar8 + 1;
          iVar15 = iVar15 + -8;
        } while (iVar15 != -8);
        lVar13 = (long)pVVar6->nSize;
        if (lVar13 <= (long)uVar14) goto LAB_0064bc28;
        lVar9 = (long)((int)lVar9 + 2);
        lVar17 = 0;
        while( true ) {
          piVar5 = pVVar6->pArray;
          lVar18 = (long)piVar5[uVar14];
          if ((lVar18 < 0) || ((int)lVar13 <= piVar5[uVar14])) goto LAB_0064bc28;
          if (piVar5[lVar18] <= lVar17) break;
          iVar12 = piVar5[lVar18 + lVar17 + 1];
          pcVar8 = pcVar7 + lVar9 * 4;
          iVar15 = 0x18;
          do {
            *pcVar8 = (char)(iVar12 >> ((byte)iVar15 & 0x1f));
            pcVar8 = pcVar8 + 1;
            iVar15 = iVar15 + -8;
          } while (iVar15 != -8);
          lVar9 = lVar9 + 1;
          lVar17 = lVar17 + 1;
          lVar13 = (long)pVVar6->nSize;
          if (lVar13 <= (long)uVar14) goto LAB_0064bc28;
        }
      }
      iVar15 = (int)lVar9;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar21);
  }
  if (iVar15 != iVar19) {
    __assert_fail("nSize2 == nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                  ,0x11f,"Vec_Str_t *Gia_AigerWriteMappingDoc(Gia_Man_t *)");
  }
  pVVar10 = (Vec_Str_t *)malloc(0x10);
  pVVar10->nSize = iVar1;
  pVVar10->nCap = iVar1;
  pVVar10->pArray = pcVar7;
  return pVVar10;
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p )
{
    unsigned char * pBuffer;
    int i, k, iFan, nLuts = 0, LutSize = 0, nSize = 2, nSize2 = 0;
    Gia_ManForEachLut( p, i )
    {
        nLuts++;
        nSize += Gia_ObjLutSize(p, i) + 2;
        LutSize = Abc_MaxInt( LutSize, Gia_ObjLutSize(p, i) );
    }
    pBuffer = ABC_ALLOC( unsigned char, 4 * nSize );
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, nLuts );  
    Gia_AigerWriteInt( pBuffer + 4 * nSize2++, LutSize );
    Gia_ManForEachLut( p, i )
    {
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, i );
        Gia_AigerWriteInt( pBuffer + 4 * nSize2++, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_AigerWriteInt( pBuffer + 4 * nSize2++, iFan );
    }
    assert( nSize2 == nSize );
    return Vec_StrAllocArray( (char *)pBuffer, 4*nSize );
}